

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
               (date_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ValidityMask *mask_00;
  idx_t i;
  ValidityMask *pVVar5;
  date_t input;
  ulong uVar6;
  ValidityMask *pVVar7;
  
  input.days = (int32_t)result_mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (pVVar5 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar5;
        pVVar5 = (ValidityMask *)
                 ((long)&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      lVar3 = DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>::
              Operation<duckdb::date_t,long>
                        ((PartOperator<duckdb::DatePart::TimezoneMinuteOperator> *)
                         (ulong)(uint)ldata[(long)pVVar5].days,input,pVVar5,(idx_t)dataptr,
                         result_mask);
      result_data[(long)pVVar5] = lVar3;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    pVVar5 = (ValidityMask *)0x0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        pVVar7 = pVVar5 + 2;
        if (count <= pVVar5 + 2) {
          pVVar7 = (ValidityMask *)count;
        }
LAB_006eee0f:
        for (; mask_00 = pVVar5, pVVar5 < pVVar7;
            pVVar5 = (ValidityMask *)
                     ((long)&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)
            ) {
          lVar3 = DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>::
                  Operation<duckdb::date_t,long>
                            ((PartOperator<duckdb::DatePart::TimezoneMinuteOperator> *)
                             (ulong)(uint)ldata[(long)pVVar5].days,input,pVVar5,(idx_t)dataptr,
                             result_mask);
          result_data[(long)pVVar5] = lVar3;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        pVVar7 = pVVar5 + 2;
        if (count <= pVVar5 + 2) {
          pVVar7 = (ValidityMask *)count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_006eee0f;
        mask_00 = pVVar7;
        if (uVar2 != 0) {
          for (uVar6 = 0;
              mask_00 = (ValidityMask *)
                        ((long)&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                        uVar6), mask_00 < pVVar7; uVar6 = uVar6 + 1) {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              lVar3 = DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>::
                      Operation<duckdb::date_t,long>
                                ((PartOperator<duckdb::DatePart::TimezoneMinuteOperator> *)
                                 (ulong)(uint)ldata[(long)&(pVVar5->
                                                  super_TemplatedValidityMask<unsigned_long>).
                                                  validity_mask + uVar6].days,input,mask_00,
                                 (idx_t)dataptr,result_mask);
              result_data
              [(long)&(pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask + uVar6] =
                   lVar3;
            }
          }
        }
      }
      pVVar5 = mask_00;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}